

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

uint ImGui::ScaleValueFromRatioT<unsigned_int,int,float>
               (ImGuiDataType data_type,float t,uint v_min,uint v_max,bool is_logarithmic,
               float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  uint uVar1;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  float v_max_fudged;
  float v_min_fudged;
  bool flipped;
  uint result;
  bool is_decimal;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  bool local_49;
  float local_34;
  float local_30;
  byte local_29;
  uint local_28;
  bool local_21;
  float local_20;
  float local_1c;
  byte local_15;
  uint local_14;
  uint local_10;
  float local_c;
  uint local_4;
  
  local_15 = in_CL & 1;
  local_4 = in_ESI;
  if (in_ESI != in_EDX) {
    local_49 = in_EDI == 8 || in_EDI == 9;
    local_21 = local_49;
    if (local_15 == 0) {
      if (in_EDI == 8 || in_EDI == 9) {
        local_28 = ImLerp<unsigned_int>(in_ESI,in_EDX,in_XMM0_Da);
      }
      else {
        local_28 = in_EDX;
        if (in_XMM0_Da < 1.0) {
          fVar2 = -0.5;
          if (in_ESI <= in_EDX) {
            fVar2 = 0.5;
          }
          local_28 = in_ESI + (int)((float)(int)(in_EDX - in_ESI) * in_XMM0_Da + fVar2);
        }
      }
    }
    else {
      local_28 = in_ESI;
      if ((0.0 < in_XMM0_Da) && (local_28 = in_EDX, in_XMM0_Da < 1.0)) {
        local_29 = in_EDX < in_ESI;
        local_20 = in_XMM2_Da;
        local_1c = in_XMM1_Da;
        local_14 = in_EDX;
        local_10 = in_ESI;
        local_c = in_XMM0_Da;
        fVar2 = ImAbs((float)in_ESI);
        if (local_1c <= fVar2) {
          local_54 = (float)local_10;
        }
        else {
          if (0.0 <= (float)local_10) {
            local_50 = local_1c;
          }
          else {
            local_50 = -local_1c;
          }
          local_54 = local_50;
        }
        local_30 = local_54;
        fVar2 = ImAbs((float)local_14);
        if (local_1c <= fVar2) {
          local_5c = (float)local_14;
        }
        else {
          if (0.0 <= (float)local_14) {
            local_58 = local_1c;
          }
          else {
            local_58 = -local_1c;
          }
          local_5c = local_58;
        }
        local_34 = local_5c;
        if ((local_29 & 1) != 0) {
          ImSwap<float>(&local_30,&local_34);
        }
        fVar2 = local_30;
        if ((((float)local_14 == 0.0) && (!NAN((float)local_14))) && ((float)local_10 < 0.0)) {
          local_34 = -local_1c;
        }
        fVar3 = local_34;
        if ((local_29 & 1) == 0) {
          local_60 = local_c;
        }
        else {
          local_60 = 1.0 - local_c;
        }
        if (0.0 <= (float)(local_10 * local_14)) {
          if (((float)local_10 < 0.0) || ((float)local_14 < 0.0)) {
            fVar2 = ImPow(0.0,2.409624e-39);
            local_28 = (uint)(long)(fVar3 * fVar2);
          }
          else {
            fVar3 = ImPow(0.0,2.409708e-39);
            local_28 = (uint)(long)(fVar2 * fVar3);
          }
        }
        else {
          uVar1 = ImMin<unsigned_int>(local_10,local_14);
          fVar2 = ImAbs((float)local_14 - (float)local_10);
          fVar2 = (float)((uint)(float)uVar1 | 0x80000000) / fVar2;
          if ((local_60 < fVar2 - local_20) || (fVar2 + local_20 < local_60)) {
            if (fVar2 <= local_60) {
              fVar2 = ImPow(0.0,2.40946e-39);
              local_28 = (uint)(long)(local_1c * fVar2);
            }
            else {
              fVar2 = ImPow(0.0,2.409323e-39);
              local_28 = (uint)(long)-(local_1c * fVar2);
            }
          }
          else {
            local_28 = 0;
          }
        }
      }
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}